

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

YamlTag_e c4::yml::to_tag(csubstr tag)

{
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr pattern_01;
  ro_substr pattern_02;
  bool bVar1;
  error_flags eVar2;
  int iVar3;
  ulong in_RSI;
  char *in_RDI;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  basic_substring<const_char> *in_stack_fffffffffffffd28;
  basic_substring<const_char> *s_;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  size_t in_stack_fffffffffffffd38;
  size_t in_stack_fffffffffffffd78;
  char *in_stack_fffffffffffffd80;
  basic_substring<const_char> *in_stack_fffffffffffffd88;
  basic_substring<char_const> local_260 [16];
  char *local_250;
  ulong local_248;
  basic_substring<char_const> local_240 [16];
  char *local_230;
  ulong local_228;
  basic_substring<char_const> local_220 [16];
  basic_substring<const_char> local_210;
  YamlTag_e local_1fa;
  char *local_1f8;
  undefined4 local_1f0;
  undefined8 local_1e8;
  basic_substring<const_char> *local_1e0;
  size_t local_1d0;
  char *local_1c8;
  undefined4 local_1c0;
  undefined8 local_1b8;
  basic_substring<const_char> *local_1b0;
  char *local_1a8;
  ulong local_1a0;
  char *local_198;
  undefined4 local_190;
  undefined8 local_188;
  basic_substring<const_char> *local_180;
  char *local_178;
  ulong local_170;
  char *local_168;
  undefined4 local_160;
  undefined8 local_158;
  basic_substring<const_char> *local_150;
  char *local_148;
  ulong local_140;
  char *local_138;
  undefined4 local_130;
  char *local_128;
  undefined4 local_120;
  long local_108;
  ulong local_100;
  basic_substring<const_char> *local_f8;
  char *local_f0;
  ulong local_e8;
  char *local_e0;
  basic_substring<const_char> *local_d8;
  char *local_d0;
  basic_substring<const_char> *local_c8;
  char *local_c0;
  basic_substring<const_char> *local_b8;
  char *local_b0;
  basic_substring<const_char> *local_a8;
  char *local_a0;
  basic_substring<const_char> *local_98;
  char *local_90;
  basic_substring<const_char> *local_88;
  char *local_80;
  basic_substring<const_char> *local_78;
  char *local_70;
  basic_substring<const_char> *local_68;
  char *local_60;
  basic_substring<const_char> *local_58;
  char *local_50;
  basic_substring<const_char> *local_48;
  char *local_40;
  basic_substring<const_char> *local_38;
  char *local_30;
  basic_substring<const_char> *local_28;
  char *local_20;
  basic_substring<const_char> *local_18;
  char *local_10;
  basic_substring<const_char> *local_8;
  
  local_210.str = in_RDI;
  local_210.len = in_RSI;
  basic_substring<char_const>::basic_substring<3ul>(local_220,(char (*) [3])"!<");
  pattern.str._7_1_ = in_stack_fffffffffffffd37;
  pattern.str._0_7_ = in_stack_fffffffffffffd30;
  pattern.len = in_stack_fffffffffffffd38;
  bVar1 = basic_substring<const_char>::begins_with(in_stack_fffffffffffffd28,pattern);
  if (bVar1) {
    local_150 = &local_210;
    local_158 = 1;
    if (local_210.len == 0) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      local_168 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_160 = 0x1533;
      handle_error(0x344e8b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (char *)in_stack_fffffffffffffd28,
               CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    local_230 = local_148;
    local_228 = local_140;
    local_210.str = local_148;
    local_210.len = local_140;
  }
  basic_substring<char_const>::basic_substring<3ul>(local_240,(char (*) [3])"!!");
  pattern_00.str._7_1_ = in_stack_fffffffffffffd37;
  pattern_00.str._0_7_ = in_stack_fffffffffffffd30;
  pattern_00.len = in_stack_fffffffffffffd38;
  bVar1 = basic_substring<const_char>::begins_with(in_stack_fffffffffffffd28,pattern_00);
  if (bVar1) {
    local_180 = &local_210;
    local_188 = 2;
    if (local_210.len < 2) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      local_198 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_190 = 0x1533;
      handle_error(0x344e8b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (char *)in_stack_fffffffffffffd28,
               CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    local_250 = local_178;
    local_248 = local_170;
    local_210.str = local_178;
    local_210.len = local_170;
  }
  else {
    bVar1 = basic_substring<const_char>::begins_with(&local_210,'!');
    if (bVar1) {
      return TAG_NONE;
    }
    basic_substring<char_const>::basic_substring<19ul>(local_260,(char (*) [19])0x358964);
    pattern_01.str._7_1_ = in_stack_fffffffffffffd37;
    pattern_01.str._0_7_ = in_stack_fffffffffffffd30;
    pattern_01.len = in_stack_fffffffffffffd38;
    bVar1 = basic_substring<const_char>::begins_with(in_stack_fffffffffffffd28,pattern_01);
    if (bVar1) {
      local_1b0 = &local_210;
      local_1b8 = 0x12;
      if (local_210.len < 0x12) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) &&
           (in_stack_fffffffffffffd37 = is_debugger_attached(), (bool)in_stack_fffffffffffffd37)) {
          trap_instruction();
        }
        local_1c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_1c0 = 0x1533;
        handle_error(0x344e8b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                 (char *)in_stack_fffffffffffffd28,
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
      local_210.str = local_1a8;
      local_210.len = local_1a0;
    }
    else {
      basic_substring<char_const>::basic_substring<20ul>
                ((basic_substring<char_const> *)&stack0xfffffffffffffd80,
                 (char (*) [20])"<tag:yaml.org,2002:");
      pattern_02.str._7_1_ = in_stack_fffffffffffffd37;
      pattern_02.str._0_7_ = in_stack_fffffffffffffd30;
      pattern_02.len = in_stack_fffffffffffffd38;
      bVar1 = basic_substring<const_char>::begins_with(in_stack_fffffffffffffd28,pattern_02);
      if (bVar1) {
        s_ = &local_210;
        local_1e8 = 0x13;
        local_1e0 = s_;
        if (local_210.len < 0x13) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) &&
             (in_stack_fffffffffffffd27 = is_debugger_attached(), (bool)in_stack_fffffffffffffd27))
          {
            trap_instruction();
          }
          local_1f8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_1f0 = 0x1533;
          handle_error(0x344e8b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),(char *)s_,
                   CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
        if (local_1d0 == 0) {
          return TAG_NONE;
        }
        local_f8 = &local_210;
        local_100 = 0;
        local_108 = 1;
        local_210.len = local_1d0;
        in_stack_fffffffffffffd78 = local_1d0;
        if (local_1d0 == 0) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_128 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_120 = 0x1561;
          handle_error(0x344e8b,(char *)0x1561,"check failed: %s","right >= 0 && right <= len");
          in_stack_fffffffffffffd78 = local_1d0;
        }
        if ((local_210.len - local_108) + 1 < local_100) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_138 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_130 = 0x1562;
          handle_error(0x344e8b,(char *)0x1562,"check failed: %s","left <= len - right + 1");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),(char *)s_,
                   CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
        local_210.str = local_f0;
        local_210.len = local_e8;
      }
    }
  }
  local_98 = &local_210;
  local_a0 = "map";
  iVar3 = basic_substring<const_char>::compare
                    (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  if (iVar3 == 0) {
    local_1fa = TAG_MAP;
  }
  else {
    local_68 = &local_210;
    local_70 = "omap";
    iVar3 = basic_substring<const_char>::compare
                      (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78
                      );
    if (iVar3 == 0) {
      local_1fa = TAG_OMAP;
    }
    else {
      local_28 = &local_210;
      local_30 = "pairs";
      iVar3 = basic_substring<const_char>::compare
                        (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                         in_stack_fffffffffffffd78);
      if (iVar3 == 0) {
        local_1fa = TAG_PAIRS;
      }
      else {
        local_a8 = &local_210;
        local_b0 = "set";
        iVar3 = basic_substring<const_char>::compare
                          (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                           in_stack_fffffffffffffd78);
        if (iVar3 == 0) {
          local_1fa = TAG_SET;
        }
        else {
          local_b8 = &local_210;
          local_c0 = "seq";
          iVar3 = basic_substring<const_char>::compare
                            (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                             in_stack_fffffffffffffd78);
          if (iVar3 == 0) {
            local_1fa = TAG_SEQ;
          }
          else {
            local_18 = &local_210;
            local_20 = "binary";
            iVar3 = basic_substring<const_char>::compare
                              (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                               in_stack_fffffffffffffd78);
            if (iVar3 == 0) {
              local_1fa = TAG_BINARY;
            }
            else {
              local_78 = &local_210;
              local_80 = "bool";
              iVar3 = basic_substring<const_char>::compare
                                (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                                 in_stack_fffffffffffffd78);
              if (iVar3 == 0) {
                local_1fa = TAG_BOOL;
              }
              else {
                local_38 = &local_210;
                local_40 = "float";
                iVar3 = basic_substring<const_char>::compare
                                  (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                                   in_stack_fffffffffffffd78);
                if (iVar3 == 0) {
                  local_1fa = TAG_FLOAT;
                }
                else {
                  local_c8 = &local_210;
                  local_d0 = "int";
                  iVar3 = basic_substring<const_char>::compare
                                    (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                                     in_stack_fffffffffffffd78);
                  if (iVar3 == 0) {
                    local_1fa = TAG_INT;
                  }
                  else {
                    local_48 = &local_210;
                    local_50 = "merge";
                    iVar3 = basic_substring<const_char>::compare
                                      (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                                       in_stack_fffffffffffffd78);
                    if (iVar3 == 0) {
                      local_1fa = TAG_MERGE;
                    }
                    else {
                      local_88 = &local_210;
                      local_90 = "null";
                      iVar3 = basic_substring<const_char>::compare
                                        (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                                         in_stack_fffffffffffffd78);
                      if (iVar3 == 0) {
                        local_1fa = TAG_NULL;
                      }
                      else {
                        local_d8 = &local_210;
                        local_e0 = "str";
                        iVar3 = basic_substring<const_char>::compare
                                          (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                                           in_stack_fffffffffffffd78);
                        if (iVar3 == 0) {
                          local_1fa = TAG_STR;
                        }
                        else {
                          local_8 = &local_210;
                          local_10 = "timestamp";
                          iVar3 = basic_substring<const_char>::compare
                                            (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                                             in_stack_fffffffffffffd78);
                          if (iVar3 == 0) {
                            local_1fa = TAG_TIMESTAMP;
                          }
                          else {
                            local_58 = &local_210;
                            local_60 = "value";
                            iVar3 = basic_substring<const_char>::compare
                                              (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                                               in_stack_fffffffffffffd78);
                            if (iVar3 == 0) {
                              local_1fa = TAG_VALUE;
                            }
                            else {
                              local_1fa = TAG_NONE;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_1fa;
}

Assistant:

YamlTag_e to_tag(csubstr tag)
{
    if(tag.begins_with("!<"))
        tag = tag.sub(1);
    if(tag.begins_with("!!"))
        tag = tag.sub(2);
    else if(tag.begins_with('!'))
        return TAG_NONE;
    else if(tag.begins_with("tag:yaml.org,2002:"))
    {
        RYML_ASSERT(csubstr("tag:yaml.org,2002:").len == 18);
        tag = tag.sub(18);
    }
    else if(tag.begins_with("<tag:yaml.org,2002:"))
    {
        RYML_ASSERT(csubstr("<tag:yaml.org,2002:").len == 19);
        tag = tag.sub(19);
        if(!tag.len)
            return TAG_NONE;
        tag = tag.offs(0, 1);
    }

    if(tag == "map")
        return TAG_MAP;
    else if(tag == "omap")
        return TAG_OMAP;
    else if(tag == "pairs")
        return TAG_PAIRS;
    else if(tag == "set")
        return TAG_SET;
    else if(tag == "seq")
        return TAG_SEQ;
    else if(tag == "binary")
        return TAG_BINARY;
    else if(tag == "bool")
        return TAG_BOOL;
    else if(tag == "float")
        return TAG_FLOAT;
    else if(tag == "int")
        return TAG_INT;
    else if(tag == "merge")
        return TAG_MERGE;
    else if(tag == "null")
        return TAG_NULL;
    else if(tag == "str")
        return TAG_STR;
    else if(tag == "timestamp")
        return TAG_TIMESTAMP;
    else if(tag == "value")
        return TAG_VALUE;

    return TAG_NONE;
}